

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_hilbert.cpp
# Opt level: O1

Read<long> __thiscall Omega_h::hilbert::dists_from_coords_dim<2>(hilbert *this,Reals *coords)

{
  int *piVar1;
  Alloc *pAVar2;
  Int i;
  long lVar3;
  type_conflict *ptVar4;
  Int i_3;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar5;
  int size_in;
  size_t sVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  Read<long> RVar9;
  Tensor<2> a;
  Write<long> out;
  Vector<2> s;
  Alloc *local_138;
  void *pvStack_130;
  type_conflict local_128;
  Write<long> local_d8;
  Alloc *local_c8;
  double dStack_c0;
  double local_b8;
  Alloc *local_b0;
  Write<long> local_a8;
  Reals local_98;
  void *local_88;
  Alloc *local_80;
  void *local_78;
  Alloc *local_70;
  Alloc *local_68;
  void *pvStack_60;
  BBox<2> local_58;
  Alloc *local_30 [2];
  
  local_98.write_.shared_alloc_.alloc = (coords->write_).shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_98.write_.shared_alloc_.alloc =
           (Alloc *)((local_98.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_98.write_.shared_alloc_.alloc)->use_count =
           (local_98.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  local_98.write_.shared_alloc_.direct_ptr = (coords->write_).shared_alloc_.direct_ptr;
  find_bounding_box<2>(&local_58,&local_98);
  pAVar2 = local_98.write_.shared_alloc_.alloc;
  if (((ulong)local_98.write_.shared_alloc_.alloc & 7) == 0 &&
      local_98.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_98.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_98.write_.shared_alloc_.alloc);
      operator_delete(pAVar2,0x48);
    }
  }
  local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0]
       = local_58.max.super_Few<double,_2>.array_[0];
  local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[1]
       = local_58.max.super_Few<double,_2>.array_[1];
  local_128.coords.write_.shared_alloc_.alloc = (Alloc *)local_58.min.super_Few<double,_2>.array_[0]
  ;
  local_128.coords.write_.shared_alloc_.direct_ptr =
       (void *)local_58.min.super_Few<double,_2>.array_[1];
  local_138 = (Alloc *)local_58.max.super_Few<double,_2>.array_[0];
  pvStack_130 = (void *)local_58.max.super_Few<double,_2>.array_[1];
  local_68 = (Alloc *)local_58.min.super_Few<double,_2>.array_[0];
  pvStack_60 = (void *)local_58.min.super_Few<double,_2>.array_[1];
  lVar3 = 0;
  do {
    (&local_d8.shared_alloc_.alloc)[lVar3] =
         (Alloc *)((double)(&local_138)[lVar3] - (double)(&local_68)[lVar3]);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  uVar7 = SUB84(local_d8.shared_alloc_.direct_ptr,0);
  uVar8 = (undefined4)((ulong)local_d8.shared_alloc_.direct_ptr >> 0x20);
  if ((double)local_d8.shared_alloc_.direct_ptr <= (double)local_d8.shared_alloc_.alloc) {
    uVar7 = SUB84(local_d8.shared_alloc_.alloc,0);
    uVar8 = (undefined4)((ulong)local_d8.shared_alloc_.alloc >> 0x20);
  }
  lVar3 = 0;
  do {
    *(double *)((long)&local_128.unit_affine.r + lVar3 * 8) =
         *(double *)((long)&local_128.unit_affine.r + lVar3 * 8 + -0x10) +
         (double)CONCAT44(uVar8,uVar7);
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_58.max.super_Few<double,_2>.array_[0] =
       local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
       array_[0];
  local_58.max.super_Few<double,_2>.array_[1] =
       local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.
       array_[1];
  local_c8 = (Alloc *)local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].
                      super_Few<double,_2>.array_[0];
  dStack_c0 = local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].
              super_Few<double,_2>.array_[1];
  local_d8.shared_alloc_.alloc = (Alloc *)local_58.min.super_Few<double,_2>.array_[0];
  local_d8.shared_alloc_.direct_ptr = (void *)local_58.min.super_Few<double,_2>.array_[1];
  lVar3 = 0;
  do {
    local_30[lVar3] =
         (Alloc *)(1.0 / ((double)(&local_c8)[lVar3] -
                         (double)(&local_d8.shared_alloc_.alloc)[lVar3]));
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_138 = local_30[0];
  pvStack_130 = local_30[1];
  ptVar4 = &local_128;
  local_128.coords.write_.shared_alloc_.direct_ptr = (void *)0x0;
  local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_[0]
       = 0.0;
  lVar3 = 0;
  do {
    *(Alloc **)&(ptVar4->coords).write_ = (&local_138)[lVar3];
    lVar3 = lVar3 + 1;
    ptVar4 = (type_conflict *)((long)&(ptVar4->unit_affine).r + 8);
  } while (lVar3 == 1);
  local_b0 = (Alloc *)local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].
                      super_Few<double,_2>.array_[0];
  local_b8 = local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>
             .array_[1];
  local_70 = local_128.coords.write_.shared_alloc_.alloc;
  local_138 = local_128.coords.write_.shared_alloc_.alloc;
  local_78 = local_128.coords.write_.shared_alloc_.direct_ptr;
  pvStack_130 = local_128.coords.write_.shared_alloc_.direct_ptr;
  lVar3 = 0;
  do {
    *(double *)((long)&local_128.unit_affine.r + lVar3 * 8 + -0x10) =
         (double)(&local_138)[lVar3] * (double)local_d8.shared_alloc_.alloc;
    pvVar5 = local_128.coords.write_.shared_alloc_.direct_ptr;
    pAVar2 = local_128.coords.write_.shared_alloc_.alloc;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_138 = (Alloc *)local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].
                       super_Few<double,_2>.array_[0];
  pvStack_130 = (void *)local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].
                        super_Few<double,_2>.array_[1];
  lVar3 = 0;
  do {
    *(double *)((long)&local_128.unit_affine.r + lVar3 * 8 + -0x10) =
         (double)(&local_138)[lVar3] * (double)local_d8.shared_alloc_.direct_ptr;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_138 = pAVar2;
  pvStack_130 = pvVar5;
  local_68 = local_128.coords.write_.shared_alloc_.alloc;
  pvStack_60 = local_128.coords.write_.shared_alloc_.direct_ptr;
  lVar3 = 0;
  do {
    *(double *)((long)&local_128.unit_affine.r + lVar3 * 8 + -0x10) =
         (double)(&local_138)[lVar3] + (double)(&local_68)[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  local_138 = local_128.coords.write_.shared_alloc_.alloc;
  pvStack_130 = local_128.coords.write_.shared_alloc_.direct_ptr;
  lVar3 = 0;
  do {
    *(ulong *)((long)&local_128.unit_affine.r + lVar3 * 8 + -0x10) =
         (ulong)(&local_138)[lVar3] ^ 0x8000000000000000;
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  pAVar2 = (coords->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar6 = pAVar2->size;
  }
  else {
    sVar6 = (ulong)pAVar2 >> 3;
  }
  if (((uint)sVar6 >> 3 & 1) == 0) {
    local_80 = local_128.coords.write_.shared_alloc_.alloc;
    local_88 = local_128.coords.write_.shared_alloc_.direct_ptr;
    local_128.coords.write_.shared_alloc_.alloc = (Alloc *)&local_128.unit_affine;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"");
    size_in = (int)(sVar6 >> 3);
    Write<long>::Write(&local_d8,size_in,(string *)&local_128);
    if (local_128.coords.write_.shared_alloc_.alloc != (Alloc *)&local_128.unit_affine) {
      operator_delete(local_128.coords.write_.shared_alloc_.alloc,
                      (ulong)((long)(size_t *)
                                    local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_
                                    [0].super_Few<double,_2>.array_[0] + 1));
    }
    local_128.coords.write_.shared_alloc_.alloc = (coords->write_).shared_alloc_.alloc;
    if (((ulong)local_128.coords.write_.shared_alloc_.alloc & 7) == 0 &&
        local_128.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_128.coords.write_.shared_alloc_.alloc =
             (Alloc *)((local_128.coords.write_.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_128.coords.write_.shared_alloc_.alloc)->use_count =
             (local_128.coords.write_.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_128.coords.write_.shared_alloc_.direct_ptr = (coords->write_).shared_alloc_.direct_ptr;
    local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_
    [0] = (double)local_70;
    local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[0].super_Few<double,_2>.array_
    [1] = (double)local_78;
    local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_
    [0] = (double)local_b0;
    local_128.unit_affine.r.super_Few<Omega_h::Vector<2>,_2>.array_[1].super_Few<double,_2>.array_
    [1] = local_b8;
    local_128.unit_affine.t.super_Few<double,_2>.array_[0] = (double)local_80;
    local_128.unit_affine.t.super_Few<double,_2>.array_[1] = (double)local_88;
    local_128.out.shared_alloc_.alloc = local_d8.shared_alloc_.alloc;
    if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 &&
        local_d8.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_128.out.shared_alloc_.alloc = (Alloc *)((local_d8.shared_alloc_.alloc)->size * 8 + 1);
      }
      else {
        (local_d8.shared_alloc_.alloc)->use_count = (local_d8.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_128.out.shared_alloc_.direct_ptr = local_d8.shared_alloc_.direct_ptr;
    parallel_for<Omega_h::hilbert::dists_from_coords_dim<2>(Omega_h::Read<double>)::_lambda(int)_1_>
              (size_in >> 1,&local_128,"hilbert::dists_from_coords");
    local_a8.shared_alloc_.alloc = local_d8.shared_alloc_.alloc;
    local_a8.shared_alloc_.direct_ptr = local_d8.shared_alloc_.direct_ptr;
    if ((((ulong)local_d8.shared_alloc_.alloc & 7) == 0 &&
         local_d8.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_d8.shared_alloc_.alloc)->use_count = (local_d8.shared_alloc_.alloc)->use_count + -1;
      local_a8.shared_alloc_.alloc = (Alloc *)((local_d8.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_d8.shared_alloc_.alloc = (Alloc *)0x0;
    local_d8.shared_alloc_.direct_ptr = (void *)0x0;
    Read<long>::Read((Read<signed_char> *)this,&local_a8);
    pAVar2 = local_a8.shared_alloc_.alloc;
    pvVar5 = extraout_RDX;
    if (((ulong)local_a8.shared_alloc_.alloc & 7) == 0 &&
        local_a8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_a8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_a8.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar5 = extraout_RDX_00;
      }
    }
    pAVar2 = local_128.out.shared_alloc_.alloc;
    if (((ulong)local_128.out.shared_alloc_.alloc & 7) == 0 &&
        local_128.out.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_128.out.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_128.out.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar5 = extraout_RDX_01;
      }
    }
    pAVar2 = local_128.coords.write_.shared_alloc_.alloc;
    if (((ulong)local_128.coords.write_.shared_alloc_.alloc & 7) == 0 &&
        local_128.coords.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_128.coords.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_128.coords.write_.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar5 = extraout_RDX_02;
      }
    }
    pAVar2 = local_d8.shared_alloc_.alloc;
    if (((ulong)local_d8.shared_alloc_.alloc & 7) == 0 &&
        local_d8.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_d8.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_d8.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar5 = extraout_RDX_03;
      }
    }
    RVar9.write_.shared_alloc_.direct_ptr = pvVar5;
    RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<long>)RVar9.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a % b == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
       ,0x11a);
}

Assistant:

Read<I64> dists_from_coords_dim(Reals coords) {
  auto bbox = find_bounding_box<dim>(coords);
  bbox = make_equilateral(bbox);
  auto unit_affine = get_affine_from_bbox_into_unit(bbox);
  auto npts = divide_no_remainder(coords.size(), dim);
  Write<I64> out(npts * dim);
  auto f = OMEGA_H_LAMBDA(LO i) {
    constexpr Int nbits = MANTISSA_BITS;
    auto spatial_coord = get_vector<dim>(coords, i);
    auto hilbert_coord =
        hilbert::from_spatial(unit_affine, nbits, spatial_coord);
    for (Int j = 0; j < dim; ++j) {
      auto sv = static_cast<I64>(hilbert_coord[j]);
      OMEGA_H_CHECK(sv >= 0);
      out[i * dim + j] = sv;
    }
  };
  parallel_for(npts, f, "hilbert::dists_from_coords");
  return out;
}